

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockCallTest_checkExpectationsClearsTheExpectations_TestShell::createTest
          (TEST_MockCallTest_checkExpectationsClearsTheExpectations_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0x56);
  TEST_MockCallTest_checkExpectationsClearsTheExpectations_Test::
  TEST_MockCallTest_checkExpectationsClearsTheExpectations_Test
            ((TEST_MockCallTest_checkExpectationsClearsTheExpectations_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, checkExpectationsClearsTheExpectations)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("foobar");
    mock().checkExpectations();

    CHECK(! mock().expectedCallsLeft());
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}